

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O0

void Cmd_get(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  char *pcVar2;
  undefined4 extraout_var;
  UCVarValue val;
  FBaseCVar *prev;
  FBaseCVar *var;
  APlayerPawn *pAStack_18;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  var._4_4_ = key;
  pAStack_18 = who;
  who_local = (APlayerPawn *)argv;
  iVar1 = FCommandLine::argc(argv);
  if (iVar1 < 2) {
    Printf("get: need variable name\n");
  }
  else {
    pcVar2 = FCommandLine::operator[]((FCommandLine *)who_local,1);
    prev = FindCVar(pcVar2,(FBaseCVar **)&val.pGUID);
    if (prev == (FBaseCVar *)0x0) {
      pcVar2 = FCommandLine::operator[]((FCommandLine *)who_local,1);
      Printf("\"%s\" is unset\n",pcVar2);
    }
    else {
      iVar1 = (*prev->_vptr_FBaseCVar[4])(prev,3);
      pcVar2 = FBaseCVar::GetName(prev);
      Printf("\"%s\" is \"%s\"\n",pcVar2,CONCAT44(extraout_var,iVar1));
    }
  }
  return;
}

Assistant:

CCMD (get)
{
	FBaseCVar *var, *prev;

	if (argv.argc() >= 2)
	{
		if ( (var = FindCVar (argv[1], &prev)) )
		{
			UCVarValue val;
			val = var->GetGenericRep (CVAR_String);
			Printf ("\"%s\" is \"%s\"\n", var->GetName(), val.String);
		}
		else
		{
			Printf ("\"%s\" is unset\n", argv[1]);
		}
	}
	else
	{
		Printf ("get: need variable name\n");
	}
}